

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure744.c
# Opt level: O3

void test_write_disk_secure744(void)

{
  undefined8 *puVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  wchar_t wVar10;
  uint *__s;
  archive *_a;
  archive_entry *paVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  size_t __maxlen;
  ulong uVar15;
  short sVar16;
  undefined1 auVar19 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar17;
  undefined6 uVar18;
  
  __s = (uint *)malloc(0x2000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'/',(uint)(__s != (uint *)0x0),"buff != NULL",(void *)0x0);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                  ,L'2',L'\x12');
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'5',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  __maxlen = 0x1f9b;
  uVar14 = 0;
  uVar15 = 0;
  do {
    if (0x1e0b < uVar15) break;
    puVar1 = (undefined8 *)((long)__s + uVar15 + 0x50);
    *puVar1 = 0x7878787878787878;
    puVar1[1] = 0x7878787878787878;
    puVar1 = (undefined8 *)((long)__s + uVar15 + 0x40);
    *puVar1 = 0x7878787878787878;
    puVar1[1] = 0x7878787878787878;
    puVar1 = (undefined8 *)((long)__s + uVar15 + 0x30);
    *puVar1 = 0x7878787878787878;
    puVar1[1] = 0x7878787878787878;
    puVar1 = (undefined8 *)((long)__s + uVar15 + 0x20);
    *puVar1 = 0x7878787878787878;
    puVar1[1] = 0x7878787878787878;
    puVar1 = (undefined8 *)((long)__s + uVar15 + 0x10);
    *puVar1 = 0x7878787878787878;
    puVar1[1] = 0x7878787878787878;
    *(undefined8 *)((long)__s + uVar15) = 0x7878787878787878;
    ((undefined8 *)((long)__s + uVar15))[1] = 0x7878787878787878;
    *(undefined4 *)((long)__s + uVar15 + 0x60) = 0x78787878;
    *(undefined1 *)((long)__s + uVar15 + 100) = 0;
    auVar19._0_4_ = (int)(uVar14 / 1000) + (int)((uVar14 / 1000) / 10) * -10;
    auVar19._4_4_ = (int)(uVar14 / 100) + (int)((uVar14 / 100) / 10) * -10;
    auVar19._8_4_ = (int)(uVar14 / 10) - (int)(((uVar14 / 10) / 10) * 10);
    auVar19._12_4_ = (int)uVar14 - (int)((uVar14 / 10) * 10);
    auVar19 = auVar19 & _DAT_002bcfe0;
    sVar6 = auVar19._0_2_;
    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar19[0] - (0xff < sVar6);
    sVar6 = auVar19._2_2_;
    sVar16 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar19[2] - (0xff < sVar6),cVar2);
    sVar6 = auVar19._4_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar19[4] - (0xff < sVar6);
    sVar6 = auVar19._6_2_;
    uVar17 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar19[6] - (0xff < sVar6),
                      CONCAT12(cVar3,sVar16));
    sVar6 = auVar19._8_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar19[8] - (0xff < sVar6);
    sVar6 = auVar19._10_2_;
    uVar18 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar19[10] - (0xff < sVar6),
                      CONCAT14(cVar4,uVar17));
    sVar6 = auVar19._12_2_;
    cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar19[0xc] - (0xff < sVar6);
    sVar8 = auVar19._14_2_;
    sVar6 = (short)((uint)uVar17 >> 0x10);
    sVar7 = (short)((uint6)uVar18 >> 0x20);
    sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar19[0xe] - (0xff < sVar8),
                             CONCAT16(cVar5,uVar18)) >> 0x30);
    *__s = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                      (0 < sVar16) * (sVar16 < 0x100) * cVar2 - (0xff < sVar16)))) |
           (uint)DAT_002bcff0;
    *(undefined1 *)(__s + 1) = 0x5f;
    uVar13 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar13;
    paVar11 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'E',(uint)(paVar11 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar11,(char *)__s);
    archive_entry_set_mode(paVar11,0x81ff);
    archive_entry_copy_symlink(paVar11,testworkdir);
    iVar9 = archive_write_header(_a,paVar11);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar9,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar11);
    *(undefined1 *)((long)__s + uVar15 + 100) = 0x2f;
    snprintf((char *)((long)__s + uVar15 + 0x65),__maxlen,"target%d",uVar14);
    paVar11 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'P',(uint)(paVar11 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar11,(char *)__s);
    archive_entry_set_mode(paVar11,0x41ff);
    iVar9 = archive_write_header(_a,paVar11);
    archive_entry_free(paVar11);
    sVar12 = strlen((char *)__s);
    failure("Attempt to create target%d via %d-character symlink should have failed",(ulong)uVar13,
            sVar12 & 0xffffffff);
    wVar10 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                                 ,L'W',-0x19,"ARCHIVE_FAILED",(long)iVar9,"t",(void *)0x0);
    __maxlen = __maxlen - 0x65;
    uVar15 = uVar15 + 0x65;
  } while (wVar10 != L'\0');
  archive_free(_a);
  free(__s);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure744)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;
	size_t buff_size = 8192;
	char *buff = malloc(buff_size);
	char *p = buff;
	int n = 0;
	int t;

	assert(buff != NULL);

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	while (p + 500 < buff + buff_size) {
		memset(p, 'x', 100);
		p += 100;
		p[0] = '\0';

		buff[0] = ((n / 1000) % 10) + '0';
		buff[1] = ((n / 100) % 10)+ '0';
		buff[2] = ((n / 10) % 10)+ '0';
		buff[3] = ((n / 1) % 10)+ '0';
		buff[4] = '_';
		++n;

		/* Create a symlink pointing to the testworkdir */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFREG | 0777);
		archive_entry_copy_symlink(ae, testworkdir);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);

		*p++ = '/';
		snprintf(p, buff_size - (p - buff), "target%d", n);

		/* Try to create a file through the symlink, should fail. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFDIR | 0777);

		t = archive_write_header(a, ae);
		archive_entry_free(ae);
		failure("Attempt to create target%d via %d-character symlink should have failed", n, (int)strlen(buff));
		if(!assertEqualInt(ARCHIVE_FAILED, t)) {
			break;
		}
	}
	archive_free(a);
	free(buff);
#endif
}